

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linmath.h
# Opt level: O0

void mat4x4_dup(vec4 *M,vec4 *N)

{
  int local_20;
  int local_1c;
  int j;
  int i;
  vec4 *N_local;
  vec4 *M_local;
  
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
      M[local_1c][local_20] = N[local_1c][local_20];
    }
  }
  return;
}

Assistant:

static inline void mat4x4_dup(mat4x4 M, mat4x4 N)
{
	int i, j;
	for(i=0; i<4; ++i)
		for(j=0; j<4; ++j)
			M[i][j] = N[i][j];
}